

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall
cs::domain_manager::add_var_no_return<cs::var_id_const&>
          (domain_manager *this,var_id *name,var *val,bool is_override)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar2;
  runtime_error *this_00;
  byte in_CL;
  var_id *in_RSI;
  var_id *in_RDI;
  string *in_stack_fffffffffffffee8;
  runtime_error *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  string local_f0 [32];
  stack_type<cs::domain_type,_std::allocator> *in_stack_ffffffffffffff30;
  string local_80 [103];
  byte local_19;
  var_id *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  if (*(long *)in_RDI->m_domain_id == 0) {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff30);
    bVar1 = domain_type::add_var_optimal
                      ((domain_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                       in_RDI,(var *)in_stack_fffffffffffffef8,
                       SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      psVar2 = var_id::operator_cast_to_string_(local_10);
      std::__cxx11::string::string(local_f0,(string *)psVar2);
      std::operator+((char *)in_stack_fffffffffffffef8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::operator+(in_stack_fffffffffffffef8,(char *)this_00);
      runtime_error::runtime_error(this_00,in_stack_fffffffffffffee8);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff30);
    bVar1 = domain_type::add_var_optimal
                      ((domain_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                       in_RDI,(var *)in_stack_fffffffffffffef8,
                       SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
      psVar2 = var_id::operator_cast_to_string_(local_10);
      std::__cxx11::string::string(local_80,(string *)psVar2);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffef0);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffef0);
      runtime_error::runtime_error(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      __cxa_throw(__lhs,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val, bool is_override)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}